

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::DeconvolutionDepthWise_x86_avx::create_group_ops
          (DeconvolutionDepthWise_x86_avx *this,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  _func_int *p_Var4;
  _func_int **pp_Var5;
  int *piVar6;
  long *plVar7;
  ulong uVar8;
  pointer ppLVar9;
  Layer *pLVar10;
  long lVar11;
  int iVar12;
  pointer ppLVar13;
  void *in_R8;
  void *pvVar14;
  uint uVar15;
  long lVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  ParamDict pd;
  undefined1 auStack_1c8 [12];
  undefined1 auStack_1bc [20];
  undefined1 auStack_1a8 [8];
  undefined8 uStack_1a0;
  uint local_190;
  undefined4 local_18c;
  Mat local_188;
  void *local_140;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  long *local_120;
  uint local_118;
  undefined4 uStack_114;
  ulong uStack_110;
  uint local_108;
  long local_100;
  int local_ec;
  Mat local_e8;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_98;
  long local_90;
  long *local_88;
  long local_80;
  ulong local_78;
  long local_70;
  undefined1 *local_68;
  size_t local_60;
  Option *local_58;
  ModelBinFromMatArray local_50;
  ParamDict local_40;
  
  ppLVar13 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  p_Var4 = this->_vptr_DeconvolutionDepthWise_x86_avx[-3];
  iVar12 = *(int *)(&this->field_0xd8 + (long)p_Var4) * *(int *)(&this->field_0xd4 + (long)p_Var4);
  iVar1 = *(int *)(&this->field_0xd0 + (long)p_Var4);
  iVar2 = *(int *)(&this->field_0x114 + (long)p_Var4);
  uVar8 = (long)*(int *)(&this->field_0x110 + (long)p_Var4) / (long)iVar2;
  uVar8 = (long)((ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff) / (long)iVar12;
  ppLVar9 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  local_58 = opt;
  if (0 < (int)((ulong)((long)ppLVar9 - (long)ppLVar13) >> 3)) {
    lVar16 = 0;
    do {
      if (ppLVar13[lVar16] != (Layer *)0x0) {
        uStack_1a0 = 0x4965af;
        (*ppLVar13[lVar16]->_vptr_Layer[1])();
      }
      lVar16 = lVar16 + 1;
      ppLVar13 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppLVar9 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    } while (lVar16 < (int)((ulong)((long)ppLVar9 - (long)ppLVar13) >> 3));
  }
  local_98 = &this->group_ops;
  if (ppLVar9 != ppLVar13) {
    (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar13;
  }
  iVar3 = *(int *)(&this->field_0x114 + (long)this->_vptr_DeconvolutionDepthWise_x86_avx[-3]);
  local_190 = *(int *)(&this->field_0xd0 + (long)this->_vptr_DeconvolutionDepthWise_x86_avx[-3]) /
              iVar3;
  uStack_1a0 = 0x496610;
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize(local_98,(long)iVar3);
  pp_Var5 = this->_vptr_DeconvolutionDepthWise_x86_avx;
  if (0 < *(int *)(&this->field_0x114 + (long)pp_Var5[-3])) {
    local_68 = &this->field_0x120;
    local_ec = iVar12 * local_190 *
               (((int)((long)((ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff) /
                      (long)(iVar1 / iVar2)) * iVar2) / iVar3);
    local_60 = (size_t)local_ec;
    local_70 = (long)(int)local_190;
    lVar16 = 0;
    do {
      p_Var4 = pp_Var5[-3];
      lVar11 = *(long *)(&this->field_0x178 + (long)p_Var4);
      local_188.data =
           (void *)(lVar16 * local_60 * lVar11 + *(long *)(&this->field_0x168 + (long)p_Var4));
      local_188.elempack = *(int *)(&this->field_0x180 + (long)p_Var4);
      local_188.allocator = *(Allocator **)(&this->field_0x188 + (long)p_Var4);
      local_188.refcount._0_4_ = 0;
      local_188.refcount._4_4_ = 0;
      local_188.elemsize._0_4_ = (undefined4)lVar11;
      local_188.elemsize._4_4_ = (undefined4)((ulong)lVar11 >> 0x20);
      local_188.dims = 1;
      local_188.w = (int)local_60;
      local_188.h = 1;
      local_188.d = 1;
      local_188.c = 1;
      local_188.cstep = local_60;
      uStack_1a0 = 0x496701;
      Mat::clone(&local_e8,(__fn *)&local_188,(void *)0x0,1,in_R8);
      piVar6 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (local_188.allocator == (Allocator *)0x0) {
            if (local_188.data != (void *)0x0) {
              uStack_1a0 = 0x496734;
              free(local_188.data);
            }
          }
          else {
            uStack_1a0 = 0x496725;
            (*(local_188.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_188.cstep = 0;
      local_188.data = (void *)0x0;
      local_188.refcount._0_4_ = 0;
      local_188.refcount._4_4_ = 0;
      local_188.elemsize._0_4_ = 0;
      local_188.elemsize._4_4_ = 0;
      local_188.elempack = 0;
      local_188.dims = 0;
      local_188.w = 0;
      local_188.h = 0;
      local_188.d = 0;
      local_188.c = 0;
      p_Var4 = this->_vptr_DeconvolutionDepthWise_x86_avx[-3];
      bVar17 = *(int *)(&this->field_0x10c + (long)p_Var4) == 0;
      if (bVar17) {
        local_78 = 0;
        local_88 = (long *)0x0;
        local_18c = 0;
        local_80 = 0;
        pvVar14 = (void *)0x0;
        local_90 = 0;
      }
      else {
        local_80 = *(long *)(&this->field_0x1c0 + (long)p_Var4);
        pvVar14 = (void *)(lVar16 * local_70 * local_80 +
                          *(long *)(&this->field_0x1b0 + (long)p_Var4));
        local_18c = *(undefined4 *)(&this->field_0x1c8 + (long)p_Var4);
        local_88 = *(long **)(&this->field_0x1d0 + (long)p_Var4);
        local_78 = (ulong)local_190;
        local_90 = local_70;
      }
      bVar17 = !bVar17;
      uVar15 = (uint)bVar17;
      uStack_1a0 = 0x49681a;
      pLVar10 = create_layer(8);
      uStack_1a0 = 0x496825;
      ParamDict::ParamDict(&local_40);
      uStack_1a0 = 0x496833;
      ParamDict::set(&local_40,0,local_190);
      uStack_1a0 = 0x49684f;
      ParamDict::set(&local_40,1,
                     *(int *)(&this->field_0xd4 +
                             (long)this->_vptr_DeconvolutionDepthWise_x86_avx[-3]));
      uStack_1a0 = 0x49686b;
      ParamDict::set(&local_40,0xb,
                     *(int *)(&this->field_0xd8 +
                             (long)this->_vptr_DeconvolutionDepthWise_x86_avx[-3]));
      uStack_1a0 = 0x496887;
      ParamDict::set(&local_40,2,
                     *(int *)(&this->field_0xdc +
                             (long)this->_vptr_DeconvolutionDepthWise_x86_avx[-3]));
      uStack_1a0 = 0x4968a3;
      ParamDict::set(&local_40,0xc,
                     *(int *)(&this->field_0xe0 +
                             (long)this->_vptr_DeconvolutionDepthWise_x86_avx[-3]));
      uStack_1a0 = 0x4968bf;
      ParamDict::set(&local_40,3,
                     *(int *)(&this->field_0xe4 +
                             (long)this->_vptr_DeconvolutionDepthWise_x86_avx[-3]));
      uStack_1a0 = 0x4968db;
      ParamDict::set(&local_40,0xd,
                     *(int *)(&this->field_0xe8 +
                             (long)this->_vptr_DeconvolutionDepthWise_x86_avx[-3]));
      uStack_1a0 = 0x4968ea;
      ParamDict::set(&local_40,4,0);
      uStack_1a0 = 0x4968f9;
      ParamDict::set(&local_40,0xe,0);
      uStack_1a0 = 0x496915;
      ParamDict::set(&local_40,0x12,
                     *(int *)(&this->field_0xfc +
                             (long)this->_vptr_DeconvolutionDepthWise_x86_avx[-3]));
      uStack_1a0 = 0x496931;
      ParamDict::set(&local_40,0x13,
                     *(int *)(&this->field_0x100 +
                             (long)this->_vptr_DeconvolutionDepthWise_x86_avx[-3]));
      uStack_1a0 = 0x49694d;
      ParamDict::set(&local_40,5,
                     *(int *)(&this->field_0x10c +
                             (long)this->_vptr_DeconvolutionDepthWise_x86_avx[-3]));
      uStack_1a0 = 0x496961;
      ParamDict::set(&local_40,6,local_ec);
      uStack_1a0 = 0x49697d;
      ParamDict::set(&local_40,9,
                     *(int *)(&this->field_0x118 +
                             (long)this->_vptr_DeconvolutionDepthWise_x86_avx[-3]));
      uStack_1a0 = 0x496999;
      ParamDict::set(&local_40,10,
                     (Mat *)(local_68 + (long)this->_vptr_DeconvolutionDepthWise_x86_avx[-3]));
      uStack_1a0 = 0x4969a5;
      (*pLVar10->_vptr_Layer[2])(pLVar10,&local_40);
      if (*(int *)(&this->field_0x10c + (long)this->_vptr_DeconvolutionDepthWise_x86_avx[-3]) == 0)
      {
        piVar6 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        local_188.data = local_e8.data;
        local_188.refcount._0_4_ = local_e8.refcount._0_4_;
        local_188.refcount._4_4_ = local_e8.refcount._4_4_;
        local_188.elemsize._0_4_ = (undefined4)local_e8.elemsize;
        local_188.elemsize._4_4_ = local_e8.elemsize._4_4_;
        local_188.elempack = local_e8.elempack;
        local_188.allocator = local_e8.allocator;
        local_188.dims = local_e8.dims;
        local_188.w = local_e8.w;
        local_188.h = local_e8.h;
        local_188.d = local_e8.d;
        local_188.c = local_e8.c;
        local_188.cstep = local_e8.cstep;
        uStack_1a0 = 0x496d30;
        ModelBinFromMatArray::ModelBinFromMatArray(&local_50,&local_188);
        uStack_1a0 = 0x496d3c;
        (*pLVar10->_vptr_Layer[3])(pLVar10,&local_50);
        uStack_1a0 = 0x496d44;
        ModelBinFromMatArray::~ModelBinFromMatArray(&local_50);
        piVar6 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_188.allocator == (Allocator *)0x0) {
              if (local_188.data != (void *)0x0) {
                uStack_1a0 = 0x496d77;
                free(local_188.data);
              }
            }
            else {
              uStack_1a0 = 0x496d68;
              (*(local_188.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_188.cstep = 0;
        local_188.data = (void *)0x0;
        local_188.refcount._0_4_ = 0;
        local_188.refcount._4_4_ = 0;
        local_188.elemsize._0_4_ = 0;
        local_188.elemsize._4_4_ = 0;
        local_188.elempack = 0;
        local_188.dims = 0;
        local_188.w = 0;
        local_188.h = 0;
        local_188.d = 0;
        local_188.c = 0;
      }
      else {
        lVar11 = 0x40;
        auVar18._0_12_ = ZEXT812(0);
        auVar18._12_4_ = 0;
        do {
          *(undefined8 *)((long)&local_188.data + lVar11) = 0;
          *(undefined1 (*) [16])(auStack_1c8 + lVar11) = auVar18;
          *(undefined1 (*) [16])(auStack_1bc + lVar11) = auVar18;
          *(undefined1 (*) [16])(auStack_1a8 + lVar11) = auVar18;
          *(undefined1 (*) [16])((long)&uStack_1a0 + lVar11 + 4) = auVar18;
          lVar11 = lVar11 + 0x48;
        } while (lVar11 != 0xd0);
        piVar6 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        piVar6 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_188.allocator == (Allocator *)0x0) {
              if (local_188.data != (void *)0x0) {
                uStack_1a0 = 0x496aa5;
                free(local_188.data);
              }
            }
            else {
              uStack_1a0 = 0x496a29;
              (*(local_188.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_188.data = local_e8.data;
        local_188.refcount._0_4_ = local_e8.refcount._0_4_;
        local_188.refcount._4_4_ = local_e8.refcount._4_4_;
        local_188.elemsize._0_4_ = (undefined4)local_e8.elemsize;
        local_188.elemsize._4_4_ = local_e8.elemsize._4_4_;
        local_188.elempack = local_e8.elempack;
        local_188.allocator = local_e8.allocator;
        local_188.dims = local_e8.dims;
        local_188.w = local_e8.w;
        local_188.h = local_e8.h;
        local_188.d = local_e8.d;
        local_188.c = local_e8.c;
        local_188.cstep = local_e8.cstep;
        piVar6 = (int *)CONCAT44(uStack_134,uStack_138);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_120 == (long *)0x0) {
              if (local_140 != (void *)0x0) {
                uStack_1a0 = 0x496b5c;
                free(local_140);
              }
            }
            else {
              uStack_1a0 = 0x496b4d;
              (**(code **)(*local_120 + 0x18))();
            }
          }
        }
        uStack_138 = 0;
        uStack_134 = 0;
        uStack_130 = (undefined4)local_80;
        uStack_12c = (undefined4)((ulong)local_80 >> 0x20);
        uStack_128 = local_18c;
        local_120 = local_88;
        _local_118 = CONCAT44((int)local_78,uVar15);
        uStack_110 = (ulong)CONCAT14(bVar17,uVar15);
        local_100 = local_90;
        uStack_1a0 = 0x496c05;
        local_140 = pvVar14;
        local_108 = uVar15;
        ModelBinFromMatArray::ModelBinFromMatArray(&local_50,&local_188);
        uStack_1a0 = 0x496c11;
        (*pLVar10->_vptr_Layer[3])(pLVar10,&local_50);
        uStack_1a0 = 0x496c19;
        ModelBinFromMatArray::~ModelBinFromMatArray(&local_50);
        lVar11 = 0x48;
        do {
          piVar6 = *(int **)((long)&local_188.refcount + lVar11);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              pvVar14 = *(void **)((long)&local_188.data + lVar11);
              plVar7 = *(long **)((long)&local_188.allocator + lVar11);
              if (plVar7 == (long *)0x0) {
                if (pvVar14 != (void *)0x0) {
                  uStack_1a0 = 0x496c52;
                  free(pvVar14);
                }
              }
              else {
                uStack_1a0 = 0x496c43;
                (**(code **)(*plVar7 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_188.cstep + lVar11) = 0;
          *(undefined8 *)((long)&local_188.refcount + lVar11 + 4) = 0;
          *(undefined8 *)((long)&local_188.elemsize + lVar11 + 4) = 0;
          *(undefined8 *)((long)&local_188.data + lVar11) = 0;
          *(undefined8 *)((long)&local_188.refcount + lVar11) = 0;
          *(undefined8 *)((long)&local_188.dims + lVar11) = 0;
          *(undefined8 *)((long)&local_188.h + lVar11) = 0;
          *(undefined4 *)((long)&local_188.c + lVar11) = 0;
          lVar11 = lVar11 + -0x48;
        } while (lVar11 != -0x48);
      }
      uStack_1a0 = 0x496db1;
      (*pLVar10->_vptr_Layer[4])(pLVar10,local_58);
      (local_98->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
      super__Vector_impl_data._M_start[lVar16] = pLVar10;
      uStack_1a0 = 0x496dc8;
      ParamDict::~ParamDict(&local_40);
      piVar6 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (local_e8.allocator == (Allocator *)0x0) {
            if (local_e8.data != (void *)0x0) {
              uStack_1a0 = 0x496e04;
              free(local_e8.data);
            }
          }
          else {
            uStack_1a0 = 0x496df5;
            (*(local_e8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_e8.cstep = 0;
      local_e8.data = (void *)0x0;
      local_e8.refcount._0_4_ = 0;
      local_e8.refcount._4_4_ = 0;
      local_e8.elemsize._0_4_ = 0;
      local_e8.elemsize._4_4_ = 0;
      local_e8.elempack = 0;
      local_e8.dims = 0;
      local_e8.w = 0;
      local_e8.h = 0;
      local_e8.d = 0;
      local_e8.c = 0;
      lVar16 = lVar16 + 1;
      pp_Var5 = this->_vptr_DeconvolutionDepthWise_x86_avx;
    } while (lVar16 < *(int *)(&this->field_0x114 + (long)pp_Var5[-3]));
  }
  return 0;
}

Assistant:

int DeconvolutionDepthWise_x86_avx::create_group_ops(const Option& opt)
{
    // create Deconvolution op for each group
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    for (int i = 0; i < (int)group_ops.size(); i++)
        delete group_ops[i];

    group_ops.clear();

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    group_ops.resize(group);

    for (int g = 0; g < group; g++)
    {
        Mat weight_data_g = weight_data.range(maxk * channels_g * num_output_g * g, maxk * channels_g * num_output_g).clone();
        Mat bias_data_g;
        if (bias_term)
            bias_data_g = bias_data.range(num_output_g * g, num_output_g);

        ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::Deconvolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output_g); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, dilation_w);
        pd.set(12, dilation_h);
        pd.set(3, stride_w);
        pd.set(13, stride_h);
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(18, output_pad_right);
        pd.set(19, output_pad_bottom);
        pd.set(5, bias_term);
        pd.set(6, maxk * channels_g * num_output_g); // weight_data_size
        pd.set(9, activation_type);
        pd.set(10, activation_params);

        op->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = weight_data_g;
            weights[1] = bias_data_g;

            op->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = weight_data_g;

            op->load_model(ModelBinFromMatArray(weights));
        }

        op->create_pipeline(opt);

        group_ops[g] = op;
    }

    return 0;
}